

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

BoolExprType eval_bool_expr(BoolExpr *be)

{
  BoolExprType BVar1;
  BoolExprType local_1c;
  BoolExprStruct *pBStack_18;
  BoolExprType deflt;
  BoolExpr *be_local;
  
  switch(be->type) {
  case E_FALSE:
    be_local._4_4_ = E_FALSE;
    break;
  case E_TRUE:
    be_local._4_4_ = E_TRUE;
    break;
  default:
    be_local._4_4_ = E_UNKNOWN;
    break;
  case E_AND:
    local_1c = E_TRUE;
    for (pBStack_18 = be->subexpr; pBStack_18 != (BoolExpr *)0x0; pBStack_18 = pBStack_18->next) {
      BVar1 = eval_bool_expr(pBStack_18);
      if (BVar1 == E_FALSE) {
        return E_FALSE;
      }
      if (BVar1 == E_UNKNOWN) {
        local_1c = E_UNKNOWN;
      }
    }
    be_local._4_4_ = local_1c;
    break;
  case E_OR:
    local_1c = E_FALSE;
    for (pBStack_18 = be->subexpr; pBStack_18 != (BoolExpr *)0x0; pBStack_18 = pBStack_18->next) {
      BVar1 = eval_bool_expr(pBStack_18);
      if (BVar1 == E_TRUE) {
        return E_TRUE;
      }
      if (BVar1 == E_UNKNOWN) {
        local_1c = E_UNKNOWN;
      }
    }
    be_local._4_4_ = local_1c;
    break;
  case E_NOT:
    BVar1 = eval_bool_expr(be->subexpr);
    if (BVar1 == E_FALSE) {
      be_local._4_4_ = E_TRUE;
    }
    else if (BVar1 == E_TRUE) {
      be_local._4_4_ = E_FALSE;
    }
    else {
      be_local._4_4_ = E_UNKNOWN;
    }
  }
  return be_local._4_4_;
}

Assistant:

BoolExprType
eval_bool_expr (const BoolExpr *be)
{
  BoolExprType deflt;

  switch (be->type) {
  case E_TRUE:  return E_TRUE;
  case E_FALSE: return E_FALSE;
  case E_NOT:
    switch (eval_bool_expr (be->subexpr)) {
    case E_TRUE:  return E_FALSE;
    case E_FALSE: return E_TRUE;
    default:      return E_UNKNOWN;
    }
  case E_AND:
    deflt = E_TRUE;
    for (be=be->subexpr; be != NULL; be=be->next)
      switch (eval_bool_expr (be)) {
      case E_FALSE:   return E_FALSE;
      case E_UNKNOWN: deflt = E_UNKNOWN; break;   /* Could still be E_FALSE */
      default: break;
      }
    return deflt;
  case E_OR:
    deflt = E_FALSE;
    for (be=be->subexpr; be != NULL; be=be->next)
      switch (eval_bool_expr (be)) {
      case E_TRUE:    return E_TRUE;
      case E_UNKNOWN: deflt = E_UNKNOWN; break;   /* Could still be E_TRUE */
      default: break;
      }
    return deflt;
  default: return E_UNKNOWN;
  }
}